

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O0

void __thiscall TUPU::TImage::setURL(TImage *this,string *url)

{
  string *in_RSI;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  std::__cxx11::string::clear();
  free(*(void **)(in_RDI + 0x90));
  *(undefined8 *)(in_RDI + 0x98) = 0;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void TImage::setURL(const string & url)
{
    m_url = url;
    m_path.clear();
    std::free(m_buffer);
    m_len = 0;
    m_filename.clear();
}